

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decodeframe.c
# Opt level: O1

void decode_tile(AV1Decoder *pbi,ThreadData_conflict *td,int tile_row,int tile_col)

{
  uint8_t uVar1;
  uint8_t uVar2;
  SequenceHeader *pSVar3;
  ENTROPY_CONTEXT *pEVar4;
  byte bVar5;
  DecoderCodingBlock *pDVar6;
  DecoderCodingBlock *pDVar7;
  MACROBLOCKD *pMVar8;
  ENTROPY_CONTEXT (*paEVar9) [32];
  int iVar10;
  int iVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  uint uVar15;
  int mi_col;
  size_t __n;
  TileInfo tile_info;
  TileInfo local_50;
  TXFM_CONTEXT *local_38;
  
  uVar1 = ((pbi->common).seq_params)->monochrome;
  av1_tile_set_row(&local_50,&pbi->common,tile_row);
  av1_tile_set_col(&local_50,&pbi->common,tile_col);
  lVar14 = (long)local_50.mi_col_start;
  pSVar3 = (pbi->common).seq_params;
  uVar2 = pSVar3->monochrome;
  uVar13 = -1L << ((byte)pSVar3->mib_size_log2 & 0x3f);
  bVar5 = (byte)pSVar3->subsampling_x;
  uVar13 = (long)(int)(~(uint)uVar13 + (local_50.mi_col_end - local_50.mi_col_start)) & uVar13;
  iVar10 = local_50.mi_col_start >> (bVar5 & 0x1f);
  bVar5 = bVar5 & 0x1f;
  memset((pbi->common).above_contexts.entropy[0][tile_row] + lVar14,0,uVar13);
  uVar15 = (uint)(uVar1 == '\0') * 2 + 1;
  if (uVar2 == '\0') {
    pEVar4 = (pbi->common).above_contexts.entropy[1][tile_row];
    if ((pEVar4 == (ENTROPY_CONTEXT *)0x0) ||
       ((pbi->common).above_contexts.entropy[2][tile_row] == (ENTROPY_CONTEXT *)0x0)) {
      aom_internal_error((td->dcb).xd.error_info,AOM_CODEC_CORRUPT_FRAME,"Invalid value of planes");
    }
    else {
      __n = (size_t)((int)uVar13 >> bVar5);
      memset(pEVar4 + iVar10,0 >> bVar5,__n);
      memset((pbi->common).above_contexts.entropy[2][tile_row] + iVar10,0,__n);
    }
  }
  memset((pbi->common).above_contexts.partition[tile_row] + lVar14,0,uVar13);
  memset((pbi->common).above_contexts.txfm[tile_row] + lVar14,0x40,uVar13);
  av1_reset_loop_filter_delta((MACROBLOCKD *)td,uVar15);
  av1_reset_loop_restoration((MACROBLOCKD *)td,uVar15);
  if (local_50.mi_row_start < local_50.mi_row_end) {
    pDVar6 = &td->dcb;
    local_38 = (td->dcb).xd.left_txfm_context_buffer;
    iVar10 = local_50.mi_row_start;
    do {
      paEVar9 = (td->dcb).xd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x11) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x12) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x13) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x14) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x15) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x16) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x17) = '\0';
      paEVar9 = (td->dcb).xd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x18) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x19) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x1a) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x1b) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x1c) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x1d) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x1e) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0x1f) = '\0';
      pMVar8 = &(td->dcb).xd;
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 0) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 1) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 2) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 3) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 4) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 5) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 6) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 2) + 7) = '\0';
      paEVar9 = (td->dcb).xd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 8) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 9) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0xb) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0xc) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0xd) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0xe) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 2) + 0xf) = '\0';
      paEVar9 = (td->dcb).xd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x11) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x12) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x13) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x14) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x15) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x16) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x17) = '\0';
      paEVar9 = (td->dcb).xd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x18) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x19) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x1a) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x1b) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x1c) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x1d) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x1e) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0x1f) = '\0';
      pMVar8 = &(td->dcb).xd;
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 0) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 1) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 2) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 3) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 4) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 5) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 6) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 1) + 7) = '\0';
      paEVar9 = (td->dcb).xd.left_entropy_context;
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 8) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 9) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0xb) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0xc) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0xd) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0xe) = '\0';
      *(ENTROPY_CONTEXT *)((long)(paEVar9 + 1) + 0xf) = '\0';
      pMVar8 = &(td->dcb).xd;
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x11) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x12) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x13) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x14) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x15) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x16) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x17) = '\0';
      pMVar8 = &(td->dcb).xd;
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x18) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x19) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x1a) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x1b) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x1c) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x1d) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x1e) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0x1f) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 0) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 1) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 2) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 3) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 4) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 5) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 6) = '\0';
      *(ENTROPY_CONTEXT *)((long)((pDVar6->xd).left_entropy_context + 0) + 7) = '\0';
      pMVar8 = &(td->dcb).xd;
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 8) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 9) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 10) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0xb) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0xc) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0xd) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0xe) = '\0';
      *(ENTROPY_CONTEXT *)((long)(pMVar8->left_entropy_context + 0) + 0xf) = '\0';
      pDVar7 = &td->dcb;
      (pDVar7->xd).left_partition_context[0x10] = '\0';
      (pDVar7->xd).left_partition_context[0x11] = '\0';
      (pDVar7->xd).left_partition_context[0x12] = '\0';
      (pDVar7->xd).left_partition_context[0x13] = '\0';
      (pDVar7->xd).left_partition_context[0x14] = '\0';
      (pDVar7->xd).left_partition_context[0x15] = '\0';
      (pDVar7->xd).left_partition_context[0x16] = '\0';
      (pDVar7->xd).left_partition_context[0x17] = '\0';
      pDVar7 = &td->dcb;
      (pDVar7->xd).left_partition_context[0x18] = '\0';
      (pDVar7->xd).left_partition_context[0x19] = '\0';
      (pDVar7->xd).left_partition_context[0x1a] = '\0';
      (pDVar7->xd).left_partition_context[0x1b] = '\0';
      (pDVar7->xd).left_partition_context[0x1c] = '\0';
      (pDVar7->xd).left_partition_context[0x1d] = '\0';
      (pDVar7->xd).left_partition_context[0x1e] = '\0';
      (pDVar7->xd).left_partition_context[0x1f] = '\0';
      (td->dcb).xd.left_partition_context[0] = '\0';
      (td->dcb).xd.left_partition_context[1] = '\0';
      (td->dcb).xd.left_partition_context[2] = '\0';
      (td->dcb).xd.left_partition_context[3] = '\0';
      (td->dcb).xd.left_partition_context[4] = '\0';
      (td->dcb).xd.left_partition_context[5] = '\0';
      (td->dcb).xd.left_partition_context[6] = '\0';
      (td->dcb).xd.left_partition_context[7] = '\0';
      pDVar7 = &td->dcb;
      (pDVar7->xd).left_partition_context[8] = '\0';
      (pDVar7->xd).left_partition_context[9] = '\0';
      (pDVar7->xd).left_partition_context[10] = '\0';
      (pDVar7->xd).left_partition_context[0xb] = '\0';
      (pDVar7->xd).left_partition_context[0xc] = '\0';
      (pDVar7->xd).left_partition_context[0xd] = '\0';
      (pDVar7->xd).left_partition_context[0xe] = '\0';
      (pDVar7->xd).left_partition_context[0xf] = '\0';
      builtin_memcpy(local_38,"@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@@",0x20);
      for (mi_col = local_50.mi_col_start; mi_col < local_50.mi_col_end;
          mi_col = mi_col + ((pbi->common).seq_params)->mib_size) {
        lVar14 = 0x33b60;
        lVar12 = 0x3b60;
        uVar13 = 0;
        do {
          (td->dcb).dqcoeff_block[uVar13] =
               (tran_low_t *)((long)((td->dcb).xd.plane[0].pre + -2) + lVar12);
          (td->dcb).eob_data[uVar13] = (eob_info *)((long)((td->dcb).xd.plane[0].pre + -2) + lVar14)
          ;
          (td->dcb).cb_offset[uVar13] = 0;
          (td->dcb).txb_offset[uVar13] = 0;
          uVar13 = uVar13 + 1;
          lVar14 = lVar14 + 0x1000;
          lVar12 = lVar12 + 0x10000;
        } while (uVar15 != uVar13);
        (td->dcb).xd.plane[0].color_index_map = (td->cb_buffer_base).color_index_map[0];
        (td->dcb).xd.plane[1].color_index_map = (td->cb_buffer_base).color_index_map[1];
        (td->dcb).xd.color_index_map_offset[0] = 0;
        (td->dcb).xd.color_index_map_offset[1] = 0;
        decode_partition(pbi,td,iVar10,mi_col,td->bit_reader,((pbi->common).seq_params)->sb_size,3);
        iVar11 = aom_reader_has_overflowed(td->bit_reader);
        if (iVar11 != 0) {
          uVar15 = 1;
          goto LAB_00178245;
        }
      }
      iVar10 = iVar10 + ((pbi->common).seq_params)->mib_size;
    } while (iVar10 < local_50.mi_row_end);
  }
  iVar10 = check_trailing_bits_after_symbol_coder(td->bit_reader);
  uVar15 = (uint)(iVar10 != 0);
LAB_00178245:
  aom_merge_corrupted_flag(&(td->dcb).corrupted,uVar15);
  return;
}

Assistant:

static inline void decode_tile(AV1Decoder *pbi, ThreadData *const td,
                               int tile_row, int tile_col) {
  TileInfo tile_info;

  AV1_COMMON *const cm = &pbi->common;
  const int num_planes = av1_num_planes(cm);

  av1_tile_set_row(&tile_info, cm, tile_row);
  av1_tile_set_col(&tile_info, cm, tile_col);
  DecoderCodingBlock *const dcb = &td->dcb;
  MACROBLOCKD *const xd = &dcb->xd;

  av1_zero_above_context(cm, xd, tile_info.mi_col_start, tile_info.mi_col_end,
                         tile_row);
  av1_reset_loop_filter_delta(xd, num_planes);
  av1_reset_loop_restoration(xd, num_planes);

  for (int mi_row = tile_info.mi_row_start; mi_row < tile_info.mi_row_end;
       mi_row += cm->seq_params->mib_size) {
    av1_zero_left_context(xd);

    for (int mi_col = tile_info.mi_col_start; mi_col < tile_info.mi_col_end;
         mi_col += cm->seq_params->mib_size) {
      set_cb_buffer(pbi, dcb, &td->cb_buffer_base, num_planes, 0, 0);

      // Bit-stream parsing and decoding of the superblock
      decode_partition(pbi, td, mi_row, mi_col, td->bit_reader,
                       cm->seq_params->sb_size, 0x3);

      if (aom_reader_has_overflowed(td->bit_reader)) {
        aom_merge_corrupted_flag(&dcb->corrupted, 1);
        return;
      }
    }
  }

  int corrupted =
      (check_trailing_bits_after_symbol_coder(td->bit_reader)) ? 1 : 0;
  aom_merge_corrupted_flag(&dcb->corrupted, corrupted);
}